

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtendedKalmanFilter.cpp
# Opt level: O0

bool __thiscall
iDynTree::DiscreteExtendedKalmanFilterHelper::ekfSetStateCovariance
          (DiscreteExtendedKalmanFilterHelper *this,Span<double,__1L> *P)

{
  index_type iVar1;
  pointer peVar2;
  long in_RDI;
  bool bVar3;
  MatrixDynSize local_40 [64];
  
  iVar1 = Span<double,_-1L>::size((Span<double,__1L> *)0x5cf122);
  bVar3 = iVar1 == *(long *)(in_RDI + 8) * *(long *)(in_RDI + 8);
  if (bVar3) {
    peVar2 = Span<double,_-1L>::data((Span<double,__1L> *)0x5cf160);
    iDynTree::MatrixDynSize::MatrixDynSize
              (local_40,peVar2,*(ulong *)(in_RDI + 8),*(ulong *)(in_RDI + 8));
    iDynTree::MatrixDynSize::operator=((MatrixDynSize *)(in_RDI + 200),local_40);
    iDynTree::MatrixDynSize::~MatrixDynSize(local_40);
    *(undefined1 *)(in_RDI + 0x1e4) = 1;
  }
  else {
    iDynTree::reportError
              ("DiscreteExtendedKalmanFilterHelper","setSystemCovariance",
               "state covariance matrix size mismatch");
  }
  return bVar3;
}

Assistant:

bool iDynTree::DiscreteExtendedKalmanFilterHelper::ekfSetStateCovariance(const iDynTree::Span< double >& P)
{
    if ((size_t)P.size() != m_dim_X*m_dim_X)
    {
        iDynTree::reportError("DiscreteExtendedKalmanFilterHelper", "setSystemCovariance", "state covariance matrix size mismatch");
        return false;
    }

    m_P = iDynTree::MatrixDynSize(P.data(), m_dim_X, m_dim_X);
    m_initial_state_covariance_set = true;
    return true;
}